

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O2

void CivetServer::closeHandler(mg_connection *conn)

{
  mg_context *pmVar1;
  void *pvVar2;
  mg_connection *in_RDI;
  key_type local_18;
  
  pmVar1 = mg_get_context(in_RDI);
  pvVar2 = mg_get_user_data(pmVar1);
  pmVar1 = *(mg_context **)((long)pvVar2 + 8);
  if (pmVar1 != (mg_context *)0x0) {
    if (*(code **)((long)pvVar2 + 0x48) != (code *)0x0) {
      (**(code **)((long)pvVar2 + 0x48))();
      pmVar1 = *(mg_context **)((long)pvVar2 + 8);
    }
    mg_lock_context(pmVar1);
    std::
    _Rb_tree<const_mg_connection_*,_std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>,_std::_Select1st<std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>_>,_std::less<const_mg_connection_*>,_std::allocator<std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>_>_>
    ::erase((_Rb_tree<const_mg_connection_*,_std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>,_std::_Select1st<std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>_>,_std::less<const_mg_connection_*>,_std::allocator<std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>_>_>
             *)((long)pvVar2 + 0x10),&local_18);
    mg_unlock_context(*(mg_context **)((long)pvVar2 + 8));
  }
  return;
}

Assistant:

void
CivetServer::closeHandler(const struct mg_connection *conn)
{
	CivetServer *me = (CivetServer *)mg_get_user_data(mg_get_context(conn));
	assert(me != NULL);

	// Happens when a request hits the server before the context is saved
	if (me->context == NULL)
		return;

	if (me->userCloseHandler) {
		me->userCloseHandler(conn);
	}
	mg_lock_context(me->context);
	me->connections.erase(conn);
	mg_unlock_context(me->context);
}